

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondJump.cpp
# Opt level: O1

void __thiscall OpenMD::HBondJump::findHBonds(HBondJump *this,int frame)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  Atom *pAVar4;
  long lVar5;
  pointer ppAVar6;
  MoleculeIterator MVar7;
  bool bVar8;
  Molecule *pMVar9;
  HBondDonor *pHVar10;
  Atom *pAVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  pointer ppAVar15;
  pointer ppHVar16;
  MoleculeIterator mj;
  MoleculeIterator mi;
  Vector3d aPos;
  Vector3d hPos;
  Vector3d dPos;
  MoleculeIterator local_170;
  MoleculeIterator local_168;
  pointer local_160;
  Molecule *local_158;
  long local_150;
  double local_148;
  double dStack_140;
  double local_138;
  double local_128;
  double dStack_120;
  double local_118;
  double local_108;
  double dStack_100;
  double local_f8;
  Vector3d local_e8;
  Vector3d local_c8;
  Vector3d local_a8;
  Vector3d local_88;
  Vector3d local_68;
  Vector3d local_48;
  
  local_168._M_node = (_Base_ptr)0x0;
  local_170._M_node = (_Base_ptr)0x0;
  local_f8 = 0.0;
  local_108 = 0.0;
  dStack_100 = 0.0;
  local_118 = 0.0;
  local_128 = 0.0;
  dStack_120 = 0.0;
  local_138 = 0.0;
  local_148 = 0.0;
  dStack_140 = 0.0;
  pMVar9 = SimInfo::beginMolecule((this->super_TimeCorrFunc<double>).info_,&local_168);
  if (pMVar9 != (Molecule *)0x0) {
    do {
      ppHVar16 = (pMVar9->hBondDonors_).
                 super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (ppHVar16 ==
          (pMVar9->hBondDonors_).
          super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pHVar10 = (HBondDonor *)0x0;
      }
      else {
        pHVar10 = *ppHVar16;
      }
      while (pHVar10 != (HBondDonor *)0x0) {
        ppHVar16 = ppHVar16 + 1;
        (*(this->super_TimeCorrFunc<double>).super_DynamicProperty._vptr_DynamicProperty[0x14])
                  (this,(ulong)(uint)frame,
                   (ulong)(uint)(pHVar10->donatedHydrogen->super_StuntDouble).globalIndex_);
        if (ppHVar16 ==
            (pMVar9->hBondDonors_).
            super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pHVar10 = (HBondDonor *)0x0;
        }
        else {
          pHVar10 = *ppHVar16;
        }
      }
      pMVar9 = SimInfo::nextMolecule((this->super_TimeCorrFunc<double>).info_,&local_168);
    } while (pMVar9 != (Molecule *)0x0);
  }
  local_158 = SimInfo::beginMolecule((this->super_TimeCorrFunc<double>).info_,&local_168);
  if (local_158 == (Molecule *)0x0) {
    return;
  }
  local_150 = (long)frame;
LAB_00139091:
  ppAVar15 = (pointer)(local_158->hBondDonors_).
                      super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
  MVar7._M_node = local_170._M_node;
  local_170._M_node = local_168._M_node;
  ppAVar6 = local_160;
  if (ppAVar15 ==
      (pointer)(local_158->hBondDonors_).
               super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
    pAVar11 = (Atom *)0x0;
  }
  else {
    pAVar11 = *ppAVar15;
  }
  while (local_160 = ppAVar15, local_168._M_node = local_170._M_node, pAVar11 != (Atom *)0x0) {
    pAVar4 = (Atom *)(pAVar11->super_StuntDouble)._vptr_StuntDouble;
    iVar2 = ((*(Atom **)&(pAVar11->super_StuntDouble).objType_)->super_StuntDouble).globalIndex_;
    iVar3 = *(int *)(*(long *)&(this->GIDtoH_).
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[local_150].
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data + (long)iVar2 * 4);
    lVar5 = *(long *)((long)&(((pAVar4->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData
                             ).position.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                     (pAVar4->super_StuntDouble).storage_);
    lVar13 = (long)(pAVar4->super_StuntDouble).localIndex_;
    local_f8 = *(double *)(lVar5 + 0x10 + lVar13 * 0x18);
    pdVar1 = (double *)(lVar5 + lVar13 * 0x18);
    local_108 = *pdVar1;
    dStack_100 = pdVar1[1];
    pAVar11 = *(Atom **)&(pAVar11->super_StuntDouble).objType_;
    lVar5 = *(long *)((long)&(((pAVar11->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                             atomData).position.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                     (pAVar11->super_StuntDouble).storage_);
    lVar13 = (long)(pAVar11->super_StuntDouble).localIndex_;
    local_118 = *(double *)(lVar5 + 0x10 + lVar13 * 0x18);
    pdVar1 = (double *)(lVar5 + lVar13 * 0x18);
    local_128 = *pdVar1;
    dStack_120 = pdVar1[1];
    pMVar9 = SimInfo::beginMolecule((this->super_TimeCorrFunc<double>).info_,&local_170);
    MVar7._M_node = local_170._M_node;
    local_170._M_node = local_168._M_node;
    ppAVar6 = local_160;
    while (pMVar9 != (Molecule *)0x0) {
      ppAVar15 = (pMVar9->hBondAcceptors_).
                 super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_168._M_node = local_170._M_node;
      local_160 = ppAVar6;
      if (ppAVar15 ==
          (pMVar9->hBondAcceptors_).
          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pAVar11 = (Atom *)0x0;
      }
      else {
        pAVar11 = *ppAVar15;
      }
      while (local_170._M_node = MVar7._M_node, pAVar11 != (Atom *)0x0) {
        ppAVar15 = ppAVar15 + 1;
        lVar13 = (long)(pAVar11->super_StuntDouble).localIndex_;
        lVar5 = *(long *)((long)&(((pAVar11->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                 atomData).position.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start +
                         (pAVar11->super_StuntDouble).storage_);
        local_138 = *(double *)(lVar5 + 0x10 + lVar13 * 0x18);
        pdVar1 = (double *)(lVar5 + lVar13 * 0x18);
        local_148 = *pdVar1;
        dStack_140 = pdVar1[1];
        pdVar1 = (double *)(lVar5 + lVar13 * 0x18);
        local_88.super_Vector<double,_3U>.data_[0] = *pdVar1;
        local_88.super_Vector<double,_3U>.data_[1] = pdVar1[1];
        local_88.super_Vector<double,_3U>.data_[2] = *(double *)(lVar5 + 0x10 + lVar13 * 0x18);
        local_68.super_Vector<double,_3U>.data_[0] = local_128;
        local_68.super_Vector<double,_3U>.data_[1] = dStack_120;
        local_68.super_Vector<double,_3U>.data_[2] = local_118;
        local_48.super_Vector<double,_3U>.data_[0] = local_108;
        local_48.super_Vector<double,_3U>.data_[1] = dStack_100;
        local_48.super_Vector<double,_3U>.data_[2] = local_f8;
        bVar8 = isHBond(this,&local_48,&local_68,&local_88);
        if (bVar8) {
          registerHydrogenBond(this,frame,iVar3,iVar2,(pAVar11->super_StuntDouble).globalIndex_);
        }
        MVar7._M_node = local_170._M_node;
        if (ppAVar15 ==
            (pMVar9->hBondAcceptors_).
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pAVar11 = (Atom *)0x0;
        }
        else {
          pAVar11 = *ppAVar15;
        }
      }
      pMVar9 = SimInfo::nextMolecule((this->super_TimeCorrFunc<double>).info_,&local_170);
      MVar7._M_node = local_170._M_node;
      local_170._M_node = local_168._M_node;
      ppAVar6 = local_160;
    }
    ppAVar15 = ppAVar6 + 1;
    if (ppAVar15 ==
        (pointer)(local_158->hBondDonors_).
                 super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
      pAVar11 = (Atom *)0x0;
    }
    else {
      pAVar11 = *ppAVar15;
    }
  }
  ppAVar15 = (local_158->hBondAcceptors_).
             super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_160 = ppAVar6;
  if (ppAVar15 !=
      (local_158->hBondAcceptors_).
      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
      super__Vector_impl_data._M_finish) goto LAB_00139498;
  do {
    local_170._M_node = MVar7._M_node;
    pAVar11 = (Atom *)0x0;
    while( true ) {
      if (pAVar11 == (Atom *)0x0) {
        local_158 = SimInfo::nextMolecule((this->super_TimeCorrFunc<double>).info_,&local_168);
        if (local_158 == (Molecule *)0x0) {
          return;
        }
        goto LAB_00139091;
      }
      lVar5 = *(long *)((long)&(((pAVar11->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                               atomData).position.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start +
                       (pAVar11->super_StuntDouble).storage_);
      lVar13 = (long)(pAVar11->super_StuntDouble).localIndex_;
      local_138 = *(double *)(lVar5 + 0x10 + lVar13 * 0x18);
      pdVar1 = (double *)(lVar5 + lVar13 * 0x18);
      local_148 = *pdVar1;
      dStack_140 = pdVar1[1];
      local_170._M_node = local_168._M_node;
      local_160 = ppAVar15;
      pMVar9 = SimInfo::beginMolecule((this->super_TimeCorrFunc<double>).info_,&local_170);
      while (pMVar9 != (Molecule *)0x0) {
        ppHVar16 = (pMVar9->hBondDonors_).
                   super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if (ppHVar16 ==
            (pMVar9->hBondDonors_).
            super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pHVar10 = (HBondDonor *)0x0;
        }
        else {
          pHVar10 = *ppHVar16;
        }
        while (pHVar10 != (HBondDonor *)0x0) {
          ppHVar16 = ppHVar16 + 1;
          pAVar4 = pHVar10->donorAtom;
          iVar2 = (pHVar10->donatedHydrogen->super_StuntDouble).globalIndex_;
          iVar3 = *(int *)(*(long *)&(this->GIDtoH_).
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[local_150].
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data + (long)iVar2 * 4);
          lVar14 = (long)(pAVar4->super_StuntDouble).localIndex_;
          lVar5 = *(long *)((long)&(((pAVar4->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                   atomData).position.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                           (pAVar4->super_StuntDouble).storage_);
          local_f8 = *(double *)(lVar5 + 0x10 + lVar14 * 0x18);
          pdVar1 = (double *)(lVar5 + lVar14 * 0x18);
          local_108 = *pdVar1;
          dStack_100 = pdVar1[1];
          pAVar4 = pHVar10->donatedHydrogen;
          lVar12 = (long)(pAVar4->super_StuntDouble).localIndex_;
          lVar13 = *(long *)((long)&(((pAVar4->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                    atomData).position.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                            (pAVar4->super_StuntDouble).storage_);
          local_118 = *(double *)(lVar13 + 0x10 + lVar12 * 0x18);
          pdVar1 = (double *)(lVar13 + lVar12 * 0x18);
          local_128 = *pdVar1;
          dStack_120 = pdVar1[1];
          local_a8.super_Vector<double,_3U>.data_[2] = *(double *)(lVar5 + 0x10 + lVar14 * 0x18);
          pdVar1 = (double *)(lVar5 + lVar14 * 0x18);
          local_a8.super_Vector<double,_3U>.data_[0] = *pdVar1;
          local_a8.super_Vector<double,_3U>.data_[1] = pdVar1[1];
          local_c8.super_Vector<double,_3U>.data_[2] = *(double *)(lVar13 + 0x10 + lVar12 * 0x18);
          pdVar1 = (double *)(lVar13 + lVar12 * 0x18);
          local_c8.super_Vector<double,_3U>.data_[0] = *pdVar1;
          local_c8.super_Vector<double,_3U>.data_[1] = pdVar1[1];
          local_e8.super_Vector<double,_3U>.data_[0] = local_148;
          local_e8.super_Vector<double,_3U>.data_[1] = dStack_140;
          local_e8.super_Vector<double,_3U>.data_[2] = local_138;
          bVar8 = isHBond(this,&local_a8,&local_c8,&local_e8);
          if (bVar8) {
            registerHydrogenBond(this,frame,iVar3,iVar2,(pAVar11->super_StuntDouble).globalIndex_);
          }
          if (ppHVar16 ==
              (pMVar9->hBondDonors_).
              super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pHVar10 = (HBondDonor *)0x0;
          }
          else {
            pHVar10 = *ppHVar16;
          }
        }
        pMVar9 = SimInfo::nextMolecule((this->super_TimeCorrFunc<double>).info_,&local_170);
      }
      ppAVar15 = local_160 + 1;
      MVar7._M_node = local_170._M_node;
      if (ppAVar15 ==
          (local_158->hBondAcceptors_).
          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
          super__Vector_impl_data._M_finish) break;
LAB_00139498:
      local_170._M_node = MVar7._M_node;
      pAVar11 = *ppAVar15;
    }
  } while( true );
}

Assistant:

void HBondJump::findHBonds(int frame) {
    Molecule* mol1;
    Molecule* mol2;
    SimInfo::MoleculeIterator mi, mj;
    std::vector<Molecule::HBondDonor*>::iterator hbdi;
    Molecule::HBondDonor* hbd;
    std::vector<Atom*>::iterator hbai;
    Atom* hba;
    Vector3d dPos, hPos, aPos;
    int hInd, index, aInd;

    // Register all the possible HBond donor hydrogens:
    for (mol1 = info_->beginMolecule(mi); mol1 != NULL;
         mol1 = info_->nextMolecule(mi)) {
      for (hbd = mol1->beginHBondDonor(hbdi); hbd != NULL;
           hbd = mol1->nextHBondDonor(hbdi)) {
        hInd  = hbd->donatedHydrogen->getGlobalIndex();
        index = registerHydrogen(frame, hInd);
      }
    }

    for (mol1 = info_->beginMolecule(mi); mol1 != NULL;
         mol1 = info_->nextMolecule(mi)) {
      for (hbd = mol1->beginHBondDonor(hbdi); hbd != NULL;
           hbd = mol1->nextHBondDonor(hbdi)) {
        hInd  = hbd->donatedHydrogen->getGlobalIndex();
        index = GIDtoH_[frame][hInd];

        dPos = hbd->donorAtom->getPos();
        hPos = hbd->donatedHydrogen->getPos();

        for (mj = mi, mol2 = info_->beginMolecule(mj); mol2 != NULL;
             mol2 = info_->nextMolecule(mj)) {
          for (hba = mol2->beginHBondAcceptor(hbai); hba != NULL;
               hba = mol2->nextHBondAcceptor(hbai)) {
            aPos = hba->getPos();

            if (isHBond(dPos, hPos, aPos)) {
              aInd = hba->getGlobalIndex();
              registerHydrogenBond(frame, index, hInd, aInd);
            }
          }
        }
      }

      for (hba = mol1->beginHBondAcceptor(hbai); hba != NULL;
           hba = mol1->nextHBondAcceptor(hbai)) {
        aPos = hba->getPos();

        for (mj = mi, mol2 = info_->beginMolecule(mj); mol2 != NULL;
             mol2 = info_->nextMolecule(mj)) {
          for (hbd = mol2->beginHBondDonor(hbdi); hbd != NULL;
               hbd = mol2->nextHBondDonor(hbdi)) {
            hInd = hbd->donatedHydrogen->getGlobalIndex();
            // no need to register, just look up the index:
            index = GIDtoH_[frame][hInd];

            dPos = hbd->donorAtom->getPos();
            hPos = hbd->donatedHydrogen->getPos();

            if (isHBond(dPos, hPos, aPos)) {
              aInd = hba->getGlobalIndex();
              registerHydrogenBond(frame, index, hInd, aInd);
            }
          }
        }
      }
    }
  }